

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void assign_rnd_level(d_level *dest,d_level *src,int range)

{
  char cVar1;
  int iVar2;
  char cVar3;
  
  dest->dnum = src->dnum;
  cVar3 = src->dlevel;
  if (range < 1) {
    iVar2 = rnd(-range);
    cVar1 = -(char)iVar2;
  }
  else {
    iVar2 = rnd(range);
    cVar1 = (char)iVar2;
  }
  cVar3 = cVar3 + cVar1;
  dest->dlevel = cVar3;
  cVar1 = dungeons[dest->dnum].num_dunlevs;
  if (cVar3 <= cVar1) {
    if ('\0' < cVar3) {
      return;
    }
    cVar1 = '\x01';
  }
  dest->dlevel = cVar1;
  return;
}

Assistant:

void assign_rnd_level(d_level *dest, const d_level *src, int range)
{
	dest->dnum = src->dnum;
	dest->dlevel = src->dlevel + ((range > 0) ? rnd(range) : -rnd(-range)) ;

	if (dest->dlevel > dunlevs_in_dungeon(dest))
		dest->dlevel = dunlevs_in_dungeon(dest);
	else if (dest->dlevel < 1)
		dest->dlevel = 1;
}